

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select_base::element::element(element *this,string *v,message *msg)

{
  string *in_RSI;
  uint *in_RDI;
  basic_message<char> *in_stack_ffffffffffffffd8;
  basic_message<char> *in_stack_ffffffffffffffe0;
  
  *in_RDI = *in_RDI | 1;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 10));
  booster::locale::basic_message<char>::basic_message
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  booster::copy_ptr<cppcms::widgets::select_base::element::_data>::copy_ptr
            ((copy_ptr<cppcms::widgets::select_base::element::_data> *)(in_RDI + 0x32));
  return;
}

Assistant:

select_base::element::element(std::string const &v,locale::message const &msg) :
	need_translation(1),
	id(v),
	tr_option(msg)
{
}